

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  Scene *pSVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar33;
  float fVar34;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  float fVar44;
  float fVar45;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar47;
  float fVar56;
  float fVar57;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar59;
  undefined1 auVar55 [64];
  float fVar60;
  float fVar65;
  float fVar66;
  undefined1 auVar61 [16];
  float fVar67;
  undefined1 auVar62 [16];
  float fVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar93;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar90 [64];
  float fVar94;
  undefined1 auVar95 [16];
  float fVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar100 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [64];
  undefined1 auVar112 [64];
  float fVar113;
  undefined1 auVar114 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar126 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined8 local_a68;
  float fStack_a60;
  float fStack_a5c;
  RayQueryContext *local_a50;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  long local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  RTCFilterFunctionNArguments local_998;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar23 = ray->tfar;
    if (0.0 <= fVar23) {
      local_a50 = context;
      puVar10 = local_7d8 + 1;
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar78 = vandps_avx((undefined1  [16])aVar2,auVar78);
      auVar69._8_4_ = 0x219392ef;
      auVar69._0_8_ = 0x219392ef219392ef;
      auVar69._12_4_ = 0x219392ef;
      auVar78 = vcmpps_avx(auVar78,auVar69,1);
      auVar70._8_4_ = 0x3f800000;
      auVar70._0_8_ = 0x3f8000003f800000;
      auVar70._12_4_ = 0x3f800000;
      auVar69 = vdivps_avx(auVar70,(undefined1  [16])aVar2);
      auVar71._8_4_ = 0x5d5e0b6b;
      auVar71._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar71._12_4_ = 0x5d5e0b6b;
      auVar78 = vblendvps_avx(auVar69,auVar71,auVar78);
      auVar61._0_4_ = auVar78._0_4_ * 0.99999964;
      auVar61._4_4_ = auVar78._4_4_ * 0.99999964;
      auVar61._8_4_ = auVar78._8_4_ * 0.99999964;
      auVar61._12_4_ = auVar78._12_4_ * 0.99999964;
      auVar48._0_4_ = auVar78._0_4_ * 1.0000004;
      auVar48._4_4_ = auVar78._4_4_ * 1.0000004;
      auVar48._8_4_ = auVar78._8_4_ * 1.0000004;
      auVar48._12_4_ = auVar78._12_4_ * 1.0000004;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_8b8._4_4_ = uVar1;
      local_8b8._0_4_ = uVar1;
      local_8b8._8_4_ = uVar1;
      local_8b8._12_4_ = uVar1;
      auVar90 = ZEXT1664(local_8b8);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8c8._4_4_ = uVar1;
      local_8c8._0_4_ = uVar1;
      local_8c8._8_4_ = uVar1;
      local_8c8._12_4_ = uVar1;
      auVar100 = ZEXT1664(local_8c8);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8d8._4_4_ = uVar1;
      local_8d8._0_4_ = uVar1;
      local_8d8._8_4_ = uVar1;
      local_8d8._12_4_ = uVar1;
      auVar106 = ZEXT1664(local_8d8);
      local_8e8 = vshufps_avx(auVar61,auVar61,0);
      auVar108 = ZEXT1664(local_8e8);
      auVar78 = vmovshdup_avx(auVar61);
      local_8f8 = vshufps_avx(auVar61,auVar61,0x55);
      auVar112 = ZEXT1664(local_8f8);
      auVar69 = vshufpd_avx(auVar61,auVar61,1);
      local_908 = vshufps_avx(auVar61,auVar61,0xaa);
      auVar64 = ZEXT1664(local_908);
      local_918 = vshufps_avx(auVar48,auVar48,0);
      auVar115 = ZEXT1664(local_918);
      uVar11 = (ulong)(auVar61._0_4_ < 0.0) << 4;
      local_928 = vshufps_avx(auVar48,auVar48,0x55);
      auVar79 = ZEXT1664(local_928);
      local_938 = vshufps_avx(auVar48,auVar48,0xaa);
      auVar55 = ZEXT1664(local_938);
      uVar13 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
      uVar8 = (ulong)(auVar69._0_4_ < 0.0) << 4 | 0x40;
      uVar14 = uVar11 ^ 0x10;
      local_948 = vshufps_avx(auVar16,auVar16,0);
      auVar83 = ZEXT1664(local_948);
      local_958 = vshufps_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),0);
      auVar120 = ZEXT1664(local_958);
      local_968 = mm_lookupmask_ps._240_16_;
LAB_00b67827:
      if (puVar10 != local_7d8) {
        uVar15 = puVar10[-1];
        puVar10 = puVar10 + -1;
        while ((uVar15 & 8) == 0) {
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar11),auVar90._0_16_);
          auVar16._0_4_ = auVar108._0_4_ * auVar78._0_4_;
          auVar16._4_4_ = auVar108._4_4_ * auVar78._4_4_;
          auVar16._8_4_ = auVar108._8_4_ * auVar78._8_4_;
          auVar16._12_4_ = auVar108._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar13),auVar100._0_16_);
          auVar24._0_4_ = auVar112._0_4_ * auVar78._0_4_;
          auVar24._4_4_ = auVar112._4_4_ * auVar78._4_4_;
          auVar24._8_4_ = auVar112._8_4_ * auVar78._8_4_;
          auVar24._12_4_ = auVar112._12_4_ * auVar78._12_4_;
          auVar78 = vmaxps_avx(auVar16,auVar24);
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar8),auVar106._0_16_);
          auVar25._0_4_ = auVar64._0_4_ * auVar69._0_4_;
          auVar25._4_4_ = auVar64._4_4_ * auVar69._4_4_;
          auVar25._8_4_ = auVar64._8_4_ * auVar69._8_4_;
          auVar25._12_4_ = auVar64._12_4_ * auVar69._12_4_;
          auVar69 = vmaxps_avx(auVar25,auVar83._0_16_);
          auVar78 = vmaxps_avx(auVar78,auVar69);
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar14),auVar90._0_16_);
          auVar26._0_4_ = auVar115._0_4_ * auVar69._0_4_;
          auVar26._4_4_ = auVar115._4_4_ * auVar69._4_4_;
          auVar26._8_4_ = auVar115._8_4_ * auVar69._8_4_;
          auVar26._12_4_ = auVar115._12_4_ * auVar69._12_4_;
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar13 ^ 0x10)),
                               auVar100._0_16_);
          auVar37._0_4_ = auVar79._0_4_ * auVar69._0_4_;
          auVar37._4_4_ = auVar79._4_4_ * auVar69._4_4_;
          auVar37._8_4_ = auVar79._8_4_ * auVar69._8_4_;
          auVar37._12_4_ = auVar79._12_4_ * auVar69._12_4_;
          auVar69 = vminps_avx(auVar26,auVar37);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar8 ^ 0x10)),
                               auVar106._0_16_);
          auVar38._0_4_ = auVar55._0_4_ * auVar16._0_4_;
          auVar38._4_4_ = auVar55._4_4_ * auVar16._4_4_;
          auVar38._8_4_ = auVar55._8_4_ * auVar16._8_4_;
          auVar38._12_4_ = auVar55._12_4_ * auVar16._12_4_;
          auVar16 = vminps_avx(auVar38,auVar120._0_16_);
          auVar69 = vminps_avx(auVar69,auVar16);
          auVar78 = vcmpps_avx(auVar78,auVar69,2);
          uVar4 = vmovmskps_avx(auVar78);
          if (uVar4 == 0) goto LAB_00b67827;
          uVar5 = uVar15 & 0xfffffffffffffff0;
          lVar9 = 0;
          if ((byte)uVar4 != 0) {
            for (; ((byte)uVar4 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar5 + lVar9 * 8);
          uVar4 = (uVar4 & 0xff) - 1 & uVar4 & 0xff;
          uVar6 = (ulong)uVar4;
          if (uVar4 != 0) {
            do {
              *puVar10 = uVar15;
              puVar10 = puVar10 + 1;
              lVar9 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              uVar15 = *(ulong *)(uVar5 + lVar9 * 8);
              uVar6 = uVar6 - 1 & uVar6;
            } while (uVar6 != 0);
          }
        }
        lVar9 = (ulong)((uint)uVar15 & 0xf) - 8;
        uVar15 = uVar15 & 0xfffffffffffffff0;
        for (local_9d0 = 0; local_9d0 != lVar9; local_9d0 = local_9d0 + 1) {
          lVar7 = local_9d0 * 0xb0;
          uVar1 = *(undefined4 *)&(ray->org).field_0;
          auVar17._4_4_ = uVar1;
          auVar17._0_4_ = uVar1;
          auVar17._8_4_ = uVar1;
          auVar17._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar39._4_4_ = uVar1;
          auVar39._0_4_ = uVar1;
          auVar39._8_4_ = uVar1;
          auVar39._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar49._4_4_ = uVar1;
          auVar49._0_4_ = uVar1;
          auVar49._8_4_ = uVar1;
          auVar49._12_4_ = uVar1;
          local_a38 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + lVar7),auVar17);
          local_a48 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x10 + lVar7),auVar39);
          local_9e8 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + lVar7),auVar49);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x30 + lVar7),auVar17);
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x40 + lVar7),auVar39);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x50 + lVar7),auVar49);
          auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x60 + lVar7),auVar17);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x70 + lVar7),auVar39);
          auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x80 + lVar7),auVar49);
          local_9f8 = vsubps_avx(auVar48,local_a38);
          local_a08 = vsubps_avx(auVar61,local_a48);
          local_a18 = vsubps_avx(auVar70,local_9e8);
          fVar124 = local_a48._0_4_;
          fVar23 = fVar124 + auVar61._0_4_;
          fVar127 = local_a48._4_4_;
          fVar33 = fVar127 + auVar61._4_4_;
          fVar129 = local_a48._8_4_;
          fVar34 = fVar129 + auVar61._8_4_;
          fVar131 = local_a48._12_4_;
          fVar35 = fVar131 + auVar61._12_4_;
          fVar107 = local_9e8._0_4_;
          fVar60 = fVar107 + auVar70._0_4_;
          fVar109 = local_9e8._4_4_;
          fVar65 = fVar109 + auVar70._4_4_;
          fVar110 = local_9e8._8_4_;
          fVar66 = fVar110 + auVar70._8_4_;
          fVar111 = local_9e8._12_4_;
          fVar67 = fVar111 + auVar70._12_4_;
          fVar47 = local_a18._0_4_;
          auVar95._0_4_ = fVar23 * fVar47;
          fVar57 = local_a18._4_4_;
          auVar95._4_4_ = fVar33 * fVar57;
          fVar56 = local_a18._8_4_;
          auVar95._8_4_ = fVar34 * fVar56;
          fVar59 = local_a18._12_4_;
          auVar95._12_4_ = fVar35 * fVar59;
          fVar133 = local_a08._0_4_;
          auVar104._0_4_ = fVar133 * fVar60;
          fVar136 = local_a08._4_4_;
          auVar104._4_4_ = fVar136 * fVar65;
          fVar139 = local_a08._8_4_;
          auVar104._8_4_ = fVar139 * fVar66;
          fVar142 = local_a08._12_4_;
          auVar104._12_4_ = fVar142 * fVar67;
          auVar71 = vsubps_avx(auVar104,auVar95);
          fVar84 = local_a38._0_4_;
          fVar94 = fVar84 + auVar48._0_4_;
          fVar91 = local_a38._4_4_;
          fVar101 = fVar91 + auVar48._4_4_;
          fVar92 = local_a38._8_4_;
          fVar102 = fVar92 + auVar48._8_4_;
          fVar93 = local_a38._12_4_;
          fVar103 = fVar93 + auVar48._12_4_;
          fVar119 = local_9f8._0_4_;
          auVar62._0_4_ = fVar119 * fVar60;
          fVar121 = local_9f8._4_4_;
          auVar62._4_4_ = fVar121 * fVar65;
          fVar122 = local_9f8._8_4_;
          auVar62._8_4_ = fVar122 * fVar66;
          fVar123 = local_9f8._12_4_;
          auVar62._12_4_ = fVar123 * fVar67;
          auVar105._0_4_ = fVar94 * fVar47;
          auVar105._4_4_ = fVar101 * fVar57;
          auVar105._8_4_ = fVar102 * fVar56;
          auVar105._12_4_ = fVar103 * fVar59;
          auVar24 = vsubps_avx(auVar105,auVar62);
          auVar96._0_4_ = fVar94 * fVar133;
          auVar96._4_4_ = fVar101 * fVar136;
          auVar96._8_4_ = fVar102 * fVar139;
          auVar96._12_4_ = fVar103 * fVar142;
          auVar18._0_4_ = fVar119 * fVar23;
          auVar18._4_4_ = fVar121 * fVar33;
          auVar18._8_4_ = fVar122 * fVar34;
          auVar18._12_4_ = fVar123 * fVar35;
          auVar25 = vsubps_avx(auVar18,auVar96);
          fVar23 = (ray->dir).field_0.m128[2];
          local_aa8._4_4_ = (ray->dir).field_0.m128[1];
          local_a68._4_4_ = (ray->dir).field_0.m128[0];
          local_a88._0_4_ =
               local_a68._4_4_ * auVar71._0_4_ +
               fVar23 * auVar25._0_4_ + local_aa8._4_4_ * auVar24._0_4_;
          local_a88._4_4_ =
               local_a68._4_4_ * auVar71._4_4_ +
               fVar23 * auVar25._4_4_ + local_aa8._4_4_ * auVar24._4_4_;
          local_a88._8_4_ =
               local_a68._4_4_ * auVar71._8_4_ +
               fVar23 * auVar25._8_4_ + local_aa8._4_4_ * auVar24._8_4_;
          local_a88._12_4_ =
               local_a68._4_4_ * auVar71._12_4_ +
               fVar23 * auVar25._12_4_ + local_aa8._4_4_ * auVar24._12_4_;
          local_a28 = vsubps_avx(local_a48,auVar69);
          local_898 = vsubps_avx(local_9e8,auVar16);
          fVar65 = fVar124 + auVar69._0_4_;
          fVar66 = fVar127 + auVar69._4_4_;
          fVar67 = fVar129 + auVar69._8_4_;
          fVar94 = fVar131 + auVar69._12_4_;
          fVar101 = fVar107 + auVar16._0_4_;
          fVar102 = fVar109 + auVar16._4_4_;
          fVar103 = fVar110 + auVar16._8_4_;
          fVar68 = fVar111 + auVar16._12_4_;
          fVar33 = local_898._0_4_;
          auVar114._0_4_ = fVar65 * fVar33;
          fVar34 = local_898._4_4_;
          auVar114._4_4_ = fVar66 * fVar34;
          fVar35 = local_898._8_4_;
          auVar114._8_4_ = fVar67 * fVar35;
          fVar60 = local_898._12_4_;
          auVar114._12_4_ = fVar94 * fVar60;
          fVar134 = local_a28._0_4_;
          auVar126._0_4_ = fVar134 * fVar101;
          fVar137 = local_a28._4_4_;
          auVar126._4_4_ = fVar137 * fVar102;
          fVar140 = local_a28._8_4_;
          auVar126._8_4_ = fVar140 * fVar103;
          fVar143 = local_a28._12_4_;
          auVar126._12_4_ = fVar143 * fVar68;
          auVar71 = vsubps_avx(auVar126,auVar114);
          auVar24 = vsubps_avx(local_a38,auVar78);
          fVar125 = auVar24._0_4_;
          auVar63._0_4_ = fVar125 * fVar101;
          fVar128 = auVar24._4_4_;
          auVar63._4_4_ = fVar128 * fVar102;
          fVar130 = auVar24._8_4_;
          auVar63._8_4_ = fVar130 * fVar103;
          fVar132 = auVar24._12_4_;
          auVar63._12_4_ = fVar132 * fVar68;
          fVar101 = fVar84 + auVar78._0_4_;
          fVar102 = fVar91 + auVar78._4_4_;
          fVar103 = fVar92 + auVar78._8_4_;
          fVar68 = fVar93 + auVar78._12_4_;
          auVar97._0_4_ = fVar101 * fVar33;
          auVar97._4_4_ = fVar102 * fVar34;
          auVar97._8_4_ = fVar103 * fVar35;
          auVar97._12_4_ = fVar68 * fVar60;
          auVar24 = vsubps_avx(auVar97,auVar63);
          auVar98._8_4_ = 0x7fffffff;
          auVar98._0_8_ = 0x7fffffff7fffffff;
          auVar98._12_4_ = 0x7fffffff;
          auVar85._0_4_ = fVar134 * fVar101;
          auVar85._4_4_ = fVar137 * fVar102;
          auVar85._8_4_ = fVar140 * fVar103;
          auVar85._12_4_ = fVar143 * fVar68;
          auVar19._0_4_ = fVar125 * fVar65;
          auVar19._4_4_ = fVar128 * fVar66;
          auVar19._8_4_ = fVar130 * fVar67;
          auVar19._12_4_ = fVar132 * fVar94;
          auVar25 = vsubps_avx(auVar19,auVar85);
          local_878._0_4_ =
               local_a68._4_4_ * auVar71._0_4_ +
               fVar23 * auVar25._0_4_ + local_aa8._4_4_ * auVar24._0_4_;
          local_878._4_4_ =
               local_a68._4_4_ * auVar71._4_4_ +
               fVar23 * auVar25._4_4_ + local_aa8._4_4_ * auVar24._4_4_;
          local_878._8_4_ =
               local_a68._4_4_ * auVar71._8_4_ +
               fVar23 * auVar25._8_4_ + local_aa8._4_4_ * auVar24._8_4_;
          local_878._12_4_ =
               local_a68._4_4_ * auVar71._12_4_ +
               fVar23 * auVar25._12_4_ + local_aa8._4_4_ * auVar24._12_4_;
          auVar71 = vsubps_avx(auVar78,auVar48);
          fVar101 = auVar78._0_4_ + auVar48._0_4_;
          fVar102 = auVar78._4_4_ + auVar48._4_4_;
          fVar103 = auVar78._8_4_ + auVar48._8_4_;
          fVar68 = auVar78._12_4_ + auVar48._12_4_;
          auVar78 = vsubps_avx(auVar69,auVar61);
          fVar36 = auVar69._0_4_ + auVar61._0_4_;
          fVar44 = auVar69._4_4_ + auVar61._4_4_;
          fVar45 = auVar69._8_4_ + auVar61._8_4_;
          fVar46 = auVar69._12_4_ + auVar61._12_4_;
          auVar69 = vsubps_avx(auVar16,auVar70);
          fVar66 = auVar16._0_4_ + auVar70._0_4_;
          fVar67 = auVar16._4_4_ + auVar70._4_4_;
          fVar94 = auVar16._8_4_ + auVar70._8_4_;
          fVar58 = auVar16._12_4_ + auVar70._12_4_;
          fVar135 = auVar69._0_4_;
          auVar72._0_4_ = fVar135 * fVar36;
          fVar138 = auVar69._4_4_;
          auVar72._4_4_ = fVar138 * fVar44;
          fVar141 = auVar69._8_4_;
          auVar72._8_4_ = fVar141 * fVar45;
          fVar144 = auVar69._12_4_;
          auVar72._12_4_ = fVar144 * fVar46;
          fVar113 = auVar78._0_4_;
          auVar86._0_4_ = fVar113 * fVar66;
          fVar116 = auVar78._4_4_;
          auVar86._4_4_ = fVar116 * fVar67;
          fVar117 = auVar78._8_4_;
          auVar86._8_4_ = fVar117 * fVar94;
          fVar118 = auVar78._12_4_;
          auVar86._12_4_ = fVar118 * fVar58;
          auVar78 = vsubps_avx(auVar86,auVar72);
          fVar65 = auVar71._0_4_;
          auVar50._0_4_ = fVar65 * fVar66;
          fVar66 = auVar71._4_4_;
          auVar50._4_4_ = fVar66 * fVar67;
          fVar67 = auVar71._8_4_;
          auVar50._8_4_ = fVar67 * fVar94;
          fVar94 = auVar71._12_4_;
          auVar50._12_4_ = fVar94 * fVar58;
          auVar87._0_4_ = fVar135 * fVar101;
          auVar87._4_4_ = fVar138 * fVar102;
          auVar87._8_4_ = fVar141 * fVar103;
          auVar87._12_4_ = fVar144 * fVar68;
          auVar69 = vsubps_avx(auVar87,auVar50);
          auVar27._0_4_ = fVar113 * fVar101;
          auVar27._4_4_ = fVar116 * fVar102;
          auVar27._8_4_ = fVar117 * fVar103;
          auVar27._12_4_ = fVar118 * fVar68;
          auVar40._0_4_ = fVar65 * fVar36;
          auVar40._4_4_ = fVar66 * fVar44;
          auVar40._8_4_ = fVar67 * fVar45;
          auVar40._12_4_ = fVar94 * fVar46;
          auVar16 = vsubps_avx(auVar40,auVar27);
          local_aa8._0_4_ = local_aa8._4_4_;
          fStack_aa0 = local_aa8._4_4_;
          fStack_a9c = local_aa8._4_4_;
          local_a68._0_4_ = local_a68._4_4_;
          fStack_a60 = local_a68._4_4_;
          fStack_a5c = local_a68._4_4_;
          auVar28._0_4_ =
               local_a68._4_4_ * auVar78._0_4_ +
               fVar23 * auVar16._0_4_ + local_aa8._4_4_ * auVar69._0_4_;
          auVar28._4_4_ =
               local_a68._4_4_ * auVar78._4_4_ +
               fVar23 * auVar16._4_4_ + local_aa8._4_4_ * auVar69._4_4_;
          auVar28._8_4_ =
               local_a68._4_4_ * auVar78._8_4_ +
               fVar23 * auVar16._8_4_ + local_aa8._4_4_ * auVar69._8_4_;
          auVar28._12_4_ =
               local_a68._4_4_ * auVar78._12_4_ +
               fVar23 * auVar16._12_4_ + local_aa8._4_4_ * auVar69._12_4_;
          local_868._0_4_ = auVar28._0_4_ + local_a88._0_4_ + local_878._0_4_;
          local_868._4_4_ = auVar28._4_4_ + local_a88._4_4_ + local_878._4_4_;
          local_868._8_4_ = auVar28._8_4_ + local_a88._8_4_ + local_878._8_4_;
          local_868._12_4_ = auVar28._12_4_ + local_a88._12_4_ + local_878._12_4_;
          auVar78 = vminps_avx(local_a88,local_878);
          auVar78 = vminps_avx(auVar78,auVar28);
          local_a78 = vandps_avx(local_868,auVar98);
          auVar51._0_4_ = local_a78._0_4_ * 1.1920929e-07;
          auVar51._4_4_ = local_a78._4_4_ * 1.1920929e-07;
          auVar51._8_4_ = local_a78._8_4_ * 1.1920929e-07;
          auVar51._12_4_ = local_a78._12_4_ * 1.1920929e-07;
          uVar5 = CONCAT44(auVar51._4_4_,auVar51._0_4_);
          auVar73._0_8_ = uVar5 ^ 0x8000000080000000;
          auVar73._8_4_ = -auVar51._8_4_;
          auVar73._12_4_ = -auVar51._12_4_;
          auVar78 = vcmpps_avx(auVar78,auVar73,5);
          auVar69 = vmaxps_avx(local_a88,local_878);
          auVar69 = vmaxps_avx(auVar69,auVar28);
          auVar69 = vcmpps_avx(auVar69,auVar51,2);
          local_8a8 = vorps_avx(auVar78,auVar69);
          auVar78 = local_968 & local_8a8;
          if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar78[0xf] < '\0') {
            auVar29._0_4_ = fVar134 * fVar47;
            auVar29._4_4_ = fVar137 * fVar57;
            auVar29._8_4_ = fVar140 * fVar56;
            auVar29._12_4_ = fVar143 * fVar59;
            auVar41._0_4_ = fVar133 * fVar33;
            auVar41._4_4_ = fVar136 * fVar34;
            auVar41._8_4_ = fVar139 * fVar35;
            auVar41._12_4_ = fVar142 * fVar60;
            auVar16 = vsubps_avx(auVar41,auVar29);
            auVar52._0_4_ = fVar113 * fVar33;
            auVar52._4_4_ = fVar116 * fVar34;
            auVar52._8_4_ = fVar117 * fVar35;
            auVar52._12_4_ = fVar118 * fVar60;
            auVar74._0_4_ = fVar134 * fVar135;
            auVar74._4_4_ = fVar137 * fVar138;
            auVar74._8_4_ = fVar140 * fVar141;
            auVar74._12_4_ = fVar143 * fVar144;
            auVar48 = vsubps_avx(auVar74,auVar52);
            auVar78 = vandps_avx(auVar98,auVar29);
            auVar69 = vandps_avx(auVar98,auVar52);
            auVar78 = vcmpps_avx(auVar78,auVar69,1);
            local_808 = vblendvps_avx(auVar48,auVar16,auVar78);
            auVar42._0_4_ = fVar125 * fVar135;
            auVar42._4_4_ = fVar128 * fVar138;
            auVar42._8_4_ = fVar130 * fVar141;
            auVar42._12_4_ = fVar132 * fVar144;
            auVar53._0_4_ = fVar125 * fVar47;
            auVar53._4_4_ = fVar128 * fVar57;
            auVar53._8_4_ = fVar130 * fVar56;
            auVar53._12_4_ = fVar132 * fVar59;
            auVar75._0_4_ = fVar33 * fVar119;
            auVar75._4_4_ = fVar34 * fVar121;
            auVar75._8_4_ = fVar35 * fVar122;
            auVar75._12_4_ = fVar60 * fVar123;
            auVar16 = vsubps_avx(auVar53,auVar75);
            auVar80._0_4_ = fVar33 * fVar65;
            auVar80._4_4_ = fVar34 * fVar66;
            auVar80._8_4_ = fVar35 * fVar67;
            auVar80._12_4_ = fVar60 * fVar94;
            auVar48 = vsubps_avx(auVar80,auVar42);
            auVar78 = vandps_avx(auVar98,auVar75);
            auVar69 = vandps_avx(auVar98,auVar42);
            auVar78 = vcmpps_avx(auVar78,auVar69,1);
            local_7f8 = vblendvps_avx(auVar48,auVar16,auVar78);
            auVar20._0_4_ = fVar134 * fVar65;
            auVar20._4_4_ = fVar137 * fVar66;
            auVar20._8_4_ = fVar140 * fVar67;
            auVar20._12_4_ = fVar143 * fVar94;
            auVar54._0_4_ = fVar134 * fVar119;
            auVar54._4_4_ = fVar137 * fVar121;
            auVar54._8_4_ = fVar140 * fVar122;
            auVar54._12_4_ = fVar143 * fVar123;
            auVar76._0_4_ = fVar125 * fVar133;
            auVar76._4_4_ = fVar128 * fVar136;
            auVar76._8_4_ = fVar130 * fVar139;
            auVar76._12_4_ = fVar132 * fVar142;
            auVar81._0_4_ = fVar125 * fVar113;
            auVar81._4_4_ = fVar128 * fVar116;
            auVar81._8_4_ = fVar130 * fVar117;
            auVar81._12_4_ = fVar132 * fVar118;
            auVar16 = vsubps_avx(auVar54,auVar76);
            auVar48 = vsubps_avx(auVar81,auVar20);
            auVar78 = vandps_avx(auVar98,auVar76);
            auVar69 = vandps_avx(auVar98,auVar20);
            auVar78 = vcmpps_avx(auVar78,auVar69,1);
            local_7e8 = vblendvps_avx(auVar48,auVar16,auVar78);
            fVar47 = local_808._0_4_ * local_a68._4_4_ +
                     fVar23 * local_7e8._0_4_ + local_7f8._0_4_ * local_aa8._4_4_;
            fVar33 = local_808._4_4_ * local_a68._4_4_ +
                     fVar23 * local_7e8._4_4_ + local_7f8._4_4_ * local_aa8._4_4_;
            fVar57 = local_808._8_4_ * local_a68._4_4_ +
                     fVar23 * local_7e8._8_4_ + local_7f8._8_4_ * local_aa8._4_4_;
            fVar23 = local_808._12_4_ * local_a68._4_4_ +
                     fVar23 * local_7e8._12_4_ + local_7f8._12_4_ * local_aa8._4_4_;
            auVar77._0_4_ = fVar47 + fVar47;
            auVar77._4_4_ = fVar33 + fVar33;
            auVar77._8_4_ = fVar57 + fVar57;
            auVar77._12_4_ = fVar23 + fVar23;
            fVar34 = local_808._0_4_ * fVar84 +
                     local_7e8._0_4_ * fVar107 + local_7f8._0_4_ * fVar124;
            fVar56 = local_808._4_4_ * fVar91 +
                     local_7e8._4_4_ * fVar109 + local_7f8._4_4_ * fVar127;
            fVar35 = local_808._8_4_ * fVar92 +
                     local_7e8._8_4_ * fVar110 + local_7f8._8_4_ * fVar129;
            fVar59 = local_808._12_4_ * fVar93 +
                     local_7e8._12_4_ * fVar111 + local_7f8._12_4_ * fVar131;
            auVar78 = vrcpps_avx(auVar77);
            fVar23 = auVar78._0_4_;
            auVar88._0_4_ = auVar77._0_4_ * fVar23;
            fVar47 = auVar78._4_4_;
            auVar88._4_4_ = auVar77._4_4_ * fVar47;
            fVar33 = auVar78._8_4_;
            auVar88._8_4_ = auVar77._8_4_ * fVar33;
            fVar57 = auVar78._12_4_;
            auVar88._12_4_ = auVar77._12_4_ * fVar57;
            auVar99._8_4_ = 0x3f800000;
            auVar99._0_8_ = 0x3f8000003f800000;
            auVar99._12_4_ = 0x3f800000;
            auVar78 = vsubps_avx(auVar99,auVar88);
            local_818._0_4_ = (fVar34 + fVar34) * (fVar23 + fVar23 * auVar78._0_4_);
            local_818._4_4_ = (fVar56 + fVar56) * (fVar47 + fVar47 * auVar78._4_4_);
            local_818._8_4_ = (fVar35 + fVar35) * (fVar33 + fVar33 * auVar78._8_4_);
            local_818._12_4_ = (fVar59 + fVar59) * (fVar57 + fVar57 * auVar78._12_4_);
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar82._4_4_ = uVar1;
            auVar82._0_4_ = uVar1;
            auVar82._8_4_ = uVar1;
            auVar82._12_4_ = uVar1;
            auVar78 = vcmpps_avx(auVar82,local_818,2);
            fVar23 = ray->tfar;
            auVar89._4_4_ = fVar23;
            auVar89._0_4_ = fVar23;
            auVar89._8_4_ = fVar23;
            auVar89._12_4_ = fVar23;
            auVar69 = vcmpps_avx(local_818,auVar89,2);
            auVar78 = vandps_avx(auVar78,auVar69);
            auVar69 = vcmpps_avx(auVar77,_DAT_01f45a50,4);
            auVar78 = vandps_avx(auVar69,auVar78);
            auVar69 = vpand_avx(local_8a8,local_968);
            auVar78 = vpslld_avx(auVar78,0x1f);
            auVar78 = vpsrad_avx(auVar78,0x1f);
            local_848 = vpand_avx(auVar78,auVar69);
            uVar4 = vmovmskps_avx(local_848);
            if (uVar4 != 0) {
              local_aa8 = lVar7 + uVar15;
              local_888 = local_a88;
              local_858 = &local_aa9;
              auVar78 = vrcpps_avx(local_868);
              fVar23 = auVar78._0_4_;
              auVar30._0_4_ = local_868._0_4_ * fVar23;
              fVar47 = auVar78._4_4_;
              auVar30._4_4_ = local_868._4_4_ * fVar47;
              fVar33 = auVar78._8_4_;
              auVar30._8_4_ = local_868._8_4_ * fVar33;
              fVar57 = auVar78._12_4_;
              auVar30._12_4_ = local_868._12_4_ * fVar57;
              auVar43._8_4_ = 0x3f800000;
              auVar43._0_8_ = 0x3f8000003f800000;
              auVar43._12_4_ = 0x3f800000;
              auVar78 = vsubps_avx(auVar43,auVar30);
              auVar21._0_4_ = fVar23 + fVar23 * auVar78._0_4_;
              auVar21._4_4_ = fVar47 + fVar47 * auVar78._4_4_;
              auVar21._8_4_ = fVar33 + fVar33 * auVar78._8_4_;
              auVar21._12_4_ = fVar57 + fVar57 * auVar78._12_4_;
              auVar31._8_4_ = 0x219392ef;
              auVar31._0_8_ = 0x219392ef219392ef;
              auVar31._12_4_ = 0x219392ef;
              auVar78 = vcmpps_avx(local_a78,auVar31,5);
              auVar78 = vandps_avx(auVar78,auVar21);
              auVar32._0_4_ = local_a88._0_4_ * auVar78._0_4_;
              auVar32._4_4_ = local_a88._4_4_ * auVar78._4_4_;
              auVar32._8_4_ = local_a88._8_4_ * auVar78._8_4_;
              auVar32._12_4_ = local_a88._12_4_ * auVar78._12_4_;
              local_838 = vminps_avx(auVar32,auVar43);
              auVar22._0_4_ = local_878._0_4_ * auVar78._0_4_;
              auVar22._4_4_ = local_878._4_4_ * auVar78._4_4_;
              auVar22._8_4_ = local_878._8_4_ * auVar78._8_4_;
              auVar22._12_4_ = local_878._12_4_ * auVar78._12_4_;
              local_828 = vminps_avx(auVar22,auVar43);
              uVar5 = (ulong)(uVar4 & 0xff);
              local_a68 = local_a50->scene;
              lVar7 = lVar7 + uVar15;
              pSVar12 = local_a50->scene;
              do {
                uVar6 = 0;
                if (uVar5 != 0) {
                  for (; (uVar5 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                local_9b0 = *(uint *)(lVar7 + 0x90 + uVar6 * 4);
                pGVar3 = (pSVar12->geometries).items[local_9b0].ptr;
                if ((pGVar3->mask & ray->mask) == 0) {
                  uVar5 = uVar5 ^ 1L << (uVar6 & 0x3f);
                }
                else {
                  local_a88._0_8_ = uVar6;
                  local_a78._0_8_ = uVar5;
                  if ((local_a50->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b680ac;
                  local_a38._0_8_ = local_a50->args;
                  local_a08._0_8_ = lVar9;
                  local_9f8._0_8_ = uVar11;
                  local_9e8._0_8_ = puVar10;
                  local_998.context = local_a50->user;
                  local_9c8 = *(undefined4 *)(local_808 + uVar6 * 4);
                  local_9c4 = *(undefined4 *)(local_7f8 + uVar6 * 4);
                  local_9c0 = *(undefined4 *)(local_7e8 + uVar6 * 4);
                  local_9bc = *(undefined4 *)(local_838 + uVar6 * 4);
                  local_9b8 = *(undefined4 *)(local_828 + uVar6 * 4);
                  local_9b4 = *(undefined4 *)(local_aa8 + 0xa0 + uVar6 * 4);
                  local_9ac = (local_998.context)->instID[0];
                  local_9a8 = (local_998.context)->instPrimID[0];
                  local_a18._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_818 + uVar6 * 4);
                  local_a8c = -1;
                  local_998.valid = &local_a8c;
                  local_998.geometryUserPtr = pGVar3->userPtr;
                  local_a48._0_8_ = ray;
                  local_998.hit = (RTCHitN *)&local_9c8;
                  local_998.N = 1;
                  local_a28._0_8_ = pGVar3;
                  local_998.ray = (RTCRayN *)ray;
                  if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar3->occlusionFilterN)(&local_998), *local_998.valid != 0)) {
                    ray = (Ray *)local_a48._0_8_;
                    if ((*(code **)(local_a38._0_8_ + 0x10) == (code *)0x0) ||
                       (((*(byte *)local_a38._0_8_ & 2) == 0 &&
                        ((*(byte *)(local_a28._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00b680ac:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (**(code **)(local_a38._0_8_ + 0x10))(&local_998);
                    ray = (Ray *)local_a48._0_8_;
                    if (*local_998.valid != 0) goto LAB_00b680ac;
                  }
                  *(undefined4 *)(local_a48._0_8_ + 0x20) = local_a18._0_4_;
                  uVar5 = local_a78._0_8_ ^ 1L << (local_a88._0_8_ & 0x3f);
                  ray = (Ray *)local_a48._0_8_;
                  lVar9 = local_a08._0_8_;
                  puVar10 = (ulong *)local_9e8._0_8_;
                  uVar11 = local_9f8._0_8_;
                }
                lVar7 = local_aa8;
                pSVar12 = local_a68;
              } while (uVar5 != 0);
            }
          }
          auVar90 = ZEXT1664(local_8b8);
          auVar100 = ZEXT1664(local_8c8);
          auVar106 = ZEXT1664(local_8d8);
          auVar108 = ZEXT1664(local_8e8);
          auVar112 = ZEXT1664(local_8f8);
          auVar64 = ZEXT1664(local_908);
          auVar115 = ZEXT1664(local_918);
          auVar79 = ZEXT1664(local_928);
          auVar55 = ZEXT1664(local_938);
          auVar83 = ZEXT1664(local_948);
          auVar120 = ZEXT1664(local_958);
        }
        goto LAB_00b67827;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }